

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decompressBlock_internal
                 (ZSTD_DCtx *dctx,void *dst,size_t dstCapacity,void *src,size_t srcSize,int frame)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  ushort uVar6;
  ushort uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  BYTE *pBVar11;
  BYTE *pBVar12;
  undefined8 uVar13;
  seq_t sequence;
  seq_t sequence_00;
  seq_t sequence_01;
  U32 i;
  BIT_DStream_status BVar14;
  size_t sVar15;
  size_t sVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  BYTE *pBVar20;
  byte bVar21;
  BYTE *pBVar22;
  BYTE *pBVar23;
  int iVar24;
  BYTE *pBVar25;
  ulong uVar26;
  BYTE *pBVar27;
  void *srcBuffer;
  ulong uVar28;
  BYTE *pBVar29;
  BYTE **ppBVar30;
  size_t sVar31;
  ulong uVar32;
  BYTE *pBVar33;
  BYTE *pBVar34;
  uint uVar35;
  ulong uVar36;
  BYTE *pBVar37;
  ZSTD_longOffset_e in_stack_fffffffffffffdc8;
  BYTE *local_1f8;
  ulong local_1d8;
  BYTE *local_1d0;
  U32 nbBits_1;
  U32 nbBits_2;
  U32 nbBits_8;
  BYTE *litPtr;
  int nbSeq;
  BIT_DStream_t local_180;
  ZSTD_fseState local_158;
  ZSTD_fseState local_148;
  ZSTD_fseState local_138;
  ulong local_128 [3];
  BYTE *local_110 [2];
  long local_100;
  BYTE *local_f8;
  U32 nbBits;
  undefined4 uStack_ec;
  int local_e4;
  BYTE *local_e0;
  BYTE *litPtr_1;
  size_t sStack_d0;
  ulong uStack_c8;
  BYTE *pBStack_c0;
  seq_t sequences [4];
  
  if (0x1ffff < srcSize) {
    return 0xffffffffffffffb8;
  }
  sVar15 = ZSTD_decodeLiteralsBlock(dctx,src,srcSize);
  if (0xffffffffffffff88 < sVar15) {
    return sVar15;
  }
  iVar24 = dctx->ddictIsCold;
  sVar16 = ZSTD_decodeSeqHeaders(dctx,&nbSeq,(void *)((long)src + sVar15),srcSize - sVar15);
  if (0xffffffffffffff88 < sVar16) {
    return sVar16;
  }
  srcBuffer = (void *)((long)((long)src + sVar15) + sVar16);
  sVar16 = (srcSize - sVar15) - sVar16;
  if (iVar24 != 0) {
    dctx->ddictIsCold = 0;
    goto LAB_0014931f;
  }
  if (frame == 0) {
    if (nbSeq < 5) goto LAB_001497d2;
  }
  else if ((dctx->fParams).windowSize < 0x1000001 || nbSeq < 5) {
LAB_001497d2:
    dctx->ddictIsCold = 0;
    goto LAB_001497e1;
  }
  uVar35 = dctx->OFTptr->baseValue;
  if (8 < uVar35) {
    __assert_fail("max <= (1 << OffFSELog)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                  ,0x6597,"unsigned int ZSTD_getLongOffsetsShare(const ZSTD_seqSymbol *)");
  }
  iVar24 = 0;
  for (lVar17 = 0; bVar21 = (byte)uVar35, (uint)lVar17 >> (bVar21 & 0x1f) == 0; lVar17 = lVar17 + 1)
  {
    iVar24 = (iVar24 + 1) - (uint)(dctx->OFTptr[lVar17 + 1].nbAdditionalBits < 0x17);
  }
  dctx->ddictIsCold = 0;
  if (6 < (uint)(iVar24 << (8 - bVar21 & 0x1f))) {
LAB_0014931f:
    if (dctx->bmi2 != 0) {
      sVar15 = ZSTD_decompressSequencesLong_bmi2
                         (dctx,dst,dstCapacity,srcBuffer,sVar16,nbSeq,in_stack_fffffffffffffdc8);
      return sVar15;
    }
    pBVar37 = (BYTE *)(dstCapacity + (long)dst);
    litPtr = dctx->litPtr;
    pBVar25 = litPtr + dctx->litSize;
    local_1f8 = (BYTE *)dst;
    if (nbSeq != 0) {
      pBVar11 = (BYTE *)dctx->prefixStart;
      local_e0 = (BYTE *)dctx->virtualStart;
      pBVar12 = (BYTE *)dctx->dictEnd;
      dctx->fseEntropy = 1;
      for (lVar17 = -6; lVar17 != 0; lVar17 = lVar17 + 2) {
        *(ulong *)((long)local_110 + lVar17 * 4) =
             (ulong)*(uint *)((long)dctx->workspace + lVar17 * 2);
      }
      local_e4 = 4;
      if (nbSeq < 4) {
        local_e4 = nbSeq;
      }
      local_100 = (long)dst - (long)pBVar11;
      local_110[0] = pBVar11;
      local_110[1] = pBVar12;
      if ((long)sVar16 < 0) {
        __assert_fail("iend >= ip",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6501,
                      "size_t ZSTD_decompressSequencesLong_body(ZSTD_DCtx *, void *, size_t, const void *, size_t, int, const ZSTD_longOffset_e)"
                     );
      }
      sVar15 = BIT_initDStream(&local_180,srcBuffer,sVar16);
      if (0xffffffffffffff88 < sVar15) {
        return 0xffffffffffffffec;
      }
      ZSTD_initFseState(&local_158,&local_180,dctx->LLTptr);
      ZSTD_initFseState(&local_148,&local_180,dctx->OFTptr);
      ZSTD_initFseState(&local_138,&local_180,dctx->MLTptr);
      lVar17 = (long)local_e4;
      ppBVar30 = &sequences[0].match;
      for (uVar36 = 0;
          (BVar14 = BIT_reloadDStream(&local_180), BVar14 != BIT_DStream_overflow &&
          ((long)uVar36 < lVar17)); uVar36 = uVar36 + 1) {
        uVar6 = local_158.table[local_158.state].nextState;
        bVar21 = local_158.table[local_158.state].nbAdditionalBits;
        uVar26 = (ulong)local_158.table[local_158.state].baseValue;
        uVar7 = local_138.table[local_138.state].nextState;
        bVar1 = local_138.table[local_138.state].nbAdditionalBits;
        bVar2 = local_138.table[local_138.state].nbBits;
        uVar28 = (ulong)local_138.table[local_138.state].baseValue;
        uVar8 = local_148.table[local_148.state].nextState;
        bVar3 = local_148.table[local_148.state].nbAdditionalBits;
        bVar4 = local_148.table[local_148.state].nbBits;
        uVar35 = local_148.table[local_148.state].baseValue;
        _nbBits = CONCAT44(uStack_ec,(uint)local_158.table[local_158.state].nbBits);
        if (bVar3 < 2) {
          if (bVar3 != 0) {
            sVar15 = BIT_readBitsFast(&local_180,1);
            lVar19 = sVar15 + (uVar35 + (uVar26 == 0));
            if (lVar19 == 3) {
              uVar32 = (local_128[0] - 1) + (ulong)(local_128[0] == 1);
            }
            else {
              uVar32 = local_128[lVar19] + (ulong)(local_128[lVar19] == 0);
              if (lVar19 == 1) goto LAB_001497b0;
            }
            local_128[2] = local_128[1];
LAB_001497b0:
            local_128[1] = local_128[0];
            goto LAB_0014960b;
          }
          uVar32 = local_128[1];
          if (uVar26 == 0) goto LAB_001497b0;
        }
        else {
          if (0x1f < bVar3) goto LAB_0014ab15;
          sVar15 = BIT_readBitsFast(&local_180,(uint)bVar3);
          local_128[2] = local_128[1];
          uVar32 = sVar15 + uVar35;
          local_128[1] = local_128[0];
LAB_0014960b:
          local_128[0] = uVar32;
        }
        uVar32 = local_128[0];
        if (bVar1 != 0) {
          sVar15 = BIT_readBitsFast(&local_180,(uint)bVar1);
          uVar28 = uVar28 + sVar15;
        }
        if (0x1e < (byte)(bVar1 + bVar21 + bVar3)) {
          BIT_reloadDStream(&local_180);
        }
        if (bVar21 != 0) {
          sVar15 = BIT_readBitsFast(&local_180,(uint)bVar21);
          uVar26 = uVar26 + sVar15;
        }
        uVar18 = local_100 + uVar26;
        pBVar20 = local_110[uVar18 < uVar32];
        local_100 = uVar18 + uVar28;
        local_158.state = BIT_readBits(&local_180,nbBits);
        local_158.state = local_158.state + uVar6;
        local_138.state = BIT_readBits(&local_180,(uint)bVar2);
        local_138.state = local_138.state + uVar7;
        local_148.state = BIT_readBits(&local_180,(uint)bVar4);
        local_148.state = local_148.state + uVar8;
        ((seq_t *)(ppBVar30 + -3))->litLength = uVar26;
        ppBVar30[-2] = (BYTE *)uVar28;
        ppBVar30[-1] = (BYTE *)uVar32;
        *ppBVar30 = pBVar20 + (uVar18 - uVar32);
        ppBVar30 = ppBVar30 + 4;
      }
      if ((long)uVar36 < lVar17) {
        return 0xffffffffffffffec;
      }
      local_f8 = pBVar37 + -0x20;
      while( true ) {
        BVar14 = BIT_reloadDStream(&local_180);
        uVar26 = local_128[1];
        uVar35 = (uint)uVar36;
        if ((BVar14 == BIT_DStream_overflow) || (nbSeq <= (int)uVar35)) break;
        uVar6 = local_158.table[local_158.state].nextState;
        bVar21 = local_158.table[local_158.state].nbAdditionalBits;
        uVar36 = (ulong)local_158.table[local_158.state].baseValue;
        uVar7 = local_138.table[local_138.state].nextState;
        bVar1 = local_138.table[local_138.state].nbAdditionalBits;
        bVar2 = local_138.table[local_138.state].nbBits;
        local_1d0 = (BYTE *)(ulong)local_138.table[local_138.state].baseValue;
        uVar8 = local_148.table[local_148.state].nextState;
        bVar3 = local_148.table[local_148.state].nbAdditionalBits;
        bVar4 = local_148.table[local_148.state].nbBits;
        uVar9 = local_148.table[local_148.state].baseValue;
        _nbBits = CONCAT44(uStack_ec,(uint)local_158.table[local_158.state].nbBits);
        if (bVar3 < 2) {
          if (bVar3 != 0) {
            sVar15 = BIT_readBitsFast(&local_180,1);
            lVar17 = sVar15 + (uVar9 + (uVar36 == 0));
            if (lVar17 == 3) {
              local_1d8 = (local_128[0] - 1) + (ulong)(local_128[0] == 1);
LAB_00149f02:
              local_128[2] = local_128[1];
            }
            else {
              local_1d8 = local_128[lVar17] + (ulong)(local_128[lVar17] == 0);
              if (lVar17 != 1) goto LAB_00149f02;
            }
            local_128[1] = local_128[0];
            goto LAB_0014999e;
          }
          if (uVar36 == 0) {
            local_128[1] = local_128[0];
            local_128[0] = uVar26;
          }
        }
        else {
          if (0x1f < bVar3) goto LAB_0014ab15;
          sVar15 = BIT_readBitsFast(&local_180,(uint)bVar3);
          local_128[2] = local_128[1];
          local_1d8 = sVar15 + uVar9;
          local_128[1] = local_128[0];
LAB_0014999e:
          local_128[0] = local_1d8;
        }
        uVar26 = local_128[0];
        if (bVar1 != 0) {
          sVar15 = BIT_readBitsFast(&local_180,(uint)bVar1);
          local_1d0 = (BYTE *)((long)local_1d0 + sVar15);
        }
        if (0x1e < (byte)(bVar1 + bVar21 + bVar3)) {
          BIT_reloadDStream(&local_180);
        }
        if (bVar21 != 0) {
          sVar15 = BIT_readBitsFast(&local_180,(uint)bVar21);
          uVar36 = uVar36 + sVar15;
        }
        uVar28 = local_100 + uVar36;
        pBVar33 = local_110[uVar28 < uVar26];
        local_100 = uVar28 + (long)local_1d0;
        local_158.state = BIT_readBits(&local_180,nbBits);
        local_158.state = local_158.state + uVar6;
        local_138.state = BIT_readBits(&local_180,(uint)bVar2);
        local_138.state = local_138.state + uVar7;
        local_148.state = BIT_readBits(&local_180,(uint)bVar4);
        local_148.state = local_148.state + uVar8;
        uVar32 = (ulong)((uVar35 & 3) << 5);
        pBVar29 = *(BYTE **)((long)&sequences[0].litLength + uVar32);
        sVar31 = *(size_t *)((long)&sequences[0].matchLength + uVar32);
        pBVar20 = pBVar29 + sVar31;
        if ((long)pBVar20 <= (long)pBVar29) goto LAB_0014ab34;
        uVar18 = *(ulong *)((long)&sequences[0].offset + uVar32);
        pBVar34 = *(BYTE **)((long)&sequences[0].match + uVar32);
        pBVar22 = litPtr + (long)pBVar29;
        if ((pBVar25 < pBVar22) || (pBVar23 = local_1f8 + (long)pBVar20, local_f8 < pBVar23)) {
          sequence.matchLength = sVar31;
          sequence.litLength = (size_t)pBVar29;
          sequence.offset = uVar18;
          sequence.match = pBVar34;
          litPtr_1 = pBVar29;
          sStack_d0 = sVar31;
          uStack_c8 = uVar18;
          pBStack_c0 = pBVar34;
          pBVar20 = (BYTE *)ZSTD_execSequenceEnd
                                      (local_1f8,pBVar37,sequence,&litPtr,pBVar25,pBVar11,local_e0,
                                       pBVar12);
        }
        else {
          pBVar34 = local_1f8 + (long)pBVar29;
          if (local_f8 < pBVar34) goto LAB_0014ab53;
          uVar13 = *(undefined8 *)(litPtr + 8);
          *(undefined8 *)local_1f8 = *(undefined8 *)litPtr;
          *(undefined8 *)(local_1f8 + 8) = uVar13;
          if ((BYTE *)0x10 < pBVar29) {
            lVar17 = (long)(local_1f8 + 0x10) - (long)(litPtr + 0x10);
            if (lVar17 < 8) {
              if (-0x10 < lVar17) goto LAB_0014abcf;
            }
            else if (0xffffffffffffffe0 < lVar17 - 0x10U) goto LAB_0014abee;
            uVar13 = *(undefined8 *)(litPtr + 0x18);
            *(undefined8 *)(local_1f8 + 0x10) = *(undefined8 *)(litPtr + 0x10);
            *(undefined8 *)(local_1f8 + 0x18) = uVar13;
            if (0x10 < (long)(pBVar29 + -0x10)) {
              lVar17 = 0;
              do {
                uVar13 = *(undefined8 *)(litPtr + lVar17 + 0x20 + 8);
                pBVar29 = local_1f8 + lVar17 + 0x20;
                *(undefined8 *)pBVar29 = *(undefined8 *)(litPtr + lVar17 + 0x20);
                *(undefined8 *)(pBVar29 + 8) = uVar13;
                uVar13 = *(undefined8 *)(litPtr + lVar17 + 0x30 + 8);
                *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)(litPtr + lVar17 + 0x30);
                *(undefined8 *)(pBVar29 + 0x18) = uVar13;
                lVar17 = lVar17 + 0x20;
              } while (pBVar29 + 0x20 < pBVar34);
            }
          }
          pBVar29 = pBVar34 + -uVar18;
          litPtr = pBVar22;
          if ((ulong)((long)pBVar34 - (long)pBVar11) < uVar18) {
            if ((ulong)((long)pBVar34 - (long)local_e0) < uVar18) {
              return 0xffffffffffffffec;
            }
            lVar17 = (long)(pBVar34 + -uVar18) - (long)pBVar11;
            pBVar29 = pBVar12 + lVar17;
            if (pBVar29 + sVar31 <= pBVar12) {
              memmove(pBVar34,pBVar29,sVar31);
              goto LAB_00149c5c;
            }
            memmove(pBVar34,pBVar29,-lVar17);
            pBVar34 = pBVar34 + -lVar17;
            sVar31 = sVar31 + lVar17;
            pBVar29 = pBVar11;
          }
          if (pBVar23 < pBVar34) goto LAB_0014ab91;
          if (pBVar29 < pBVar11) goto LAB_0014ab72;
          if (sVar31 == 0) goto LAB_0014abb0;
          if (uVar18 < 0x10) {
            if (pBVar34 < pBVar29) goto LAB_0014ac6a;
            if (uVar18 < 8) {
              iVar24 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                ::dec64table + uVar18 * 4);
              *pBVar34 = *pBVar29;
              pBVar34[1] = pBVar29[1];
              pBVar34[2] = pBVar29[2];
              pBVar34[3] = pBVar29[3];
              pBVar22 = pBVar29 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                            ::dec32table + uVar18 * 4);
              pBVar29 = pBVar29 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar18 * 4) - (long)iVar24);
              *(undefined4 *)(pBVar34 + 4) = *(undefined4 *)pBVar22;
            }
            else {
              *(undefined8 *)pBVar34 = *(undefined8 *)pBVar29;
            }
            pBVar22 = pBVar29 + 8;
            pBVar27 = pBVar34 + 8;
            if ((long)pBVar27 - (long)pBVar22 < 8) goto LAB_0014ac4b;
            if (8 < sVar31) {
              if (pBVar23 <= pBVar27) goto LAB_0014ac89;
              if ((ulong)((long)pBVar27 - (long)pBVar22) < 0x10) {
                do {
                  *(undefined8 *)pBVar27 = *(undefined8 *)pBVar22;
                  pBVar27 = pBVar27 + 8;
                  pBVar22 = pBVar22 + 8;
                } while (pBVar27 < pBVar34 + sVar31);
              }
              else {
                uVar13 = *(undefined8 *)(pBVar29 + 0x10);
                *(undefined8 *)pBVar27 = *(undefined8 *)pBVar22;
                *(undefined8 *)(pBVar34 + 0x10) = uVar13;
                if (0x18 < (long)sVar31) {
                  lVar17 = 0;
                  do {
                    uVar13 = *(undefined8 *)(pBVar29 + lVar17 + 0x18 + 8);
                    pBVar22 = pBVar34 + lVar17 + 0x18;
                    *(undefined8 *)pBVar22 = *(undefined8 *)(pBVar29 + lVar17 + 0x18);
                    *(undefined8 *)(pBVar22 + 8) = uVar13;
                    uVar13 = *(undefined8 *)(pBVar29 + lVar17 + 0x28 + 8);
                    *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(pBVar29 + lVar17 + 0x28);
                    *(undefined8 *)(pBVar22 + 0x18) = uVar13;
                    lVar17 = lVar17 + 0x20;
                  } while (pBVar22 + 0x20 < pBVar34 + sVar31);
                }
              }
            }
          }
          else {
            lVar17 = (long)pBVar34 - (long)pBVar29;
            if (lVar17 < 8) {
              if (-0x10 < lVar17) goto LAB_0014abcf;
            }
            else if (0xffffffffffffffe0 < lVar17 - 0x10U) goto LAB_0014abee;
            uVar13 = *(undefined8 *)(pBVar29 + 8);
            *(undefined8 *)pBVar34 = *(undefined8 *)pBVar29;
            *(undefined8 *)(pBVar34 + 8) = uVar13;
            if (0x10 < (long)sVar31) {
              lVar17 = 0x10;
              do {
                uVar13 = *(undefined8 *)(pBVar29 + lVar17 + 8);
                pBVar22 = pBVar34 + lVar17;
                *(undefined8 *)pBVar22 = *(undefined8 *)(pBVar29 + lVar17);
                *(undefined8 *)(pBVar22 + 8) = uVar13;
                uVar13 = *(undefined8 *)(pBVar29 + lVar17 + 0x10 + 8);
                *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(pBVar29 + lVar17 + 0x10);
                *(undefined8 *)(pBVar22 + 0x18) = uVar13;
                lVar17 = lVar17 + 0x20;
              } while (pBVar22 + 0x20 < pBVar34 + sVar31);
            }
          }
        }
LAB_00149c5c:
        if ((BYTE *)0xffffffffffffff88 < pBVar20) {
          return (size_t)pBVar20;
        }
        *(ulong *)((long)&sequences[0].litLength + uVar32) = uVar36;
        *(BYTE **)((long)&sequences[0].matchLength + uVar32) = local_1d0;
        *(ulong *)((long)&sequences[0].offset + uVar32) = uVar26;
        *(BYTE **)((long)&sequences[0].match + uVar32) = pBVar33 + (uVar28 - uVar26);
        local_1f8 = local_1f8 + (long)pBVar20;
        uVar36 = (ulong)(uVar35 + 1);
      }
      if ((int)uVar35 < nbSeq) {
        return 0xffffffffffffffec;
      }
      for (uVar35 = uVar35 - local_e4; (int)uVar35 < nbSeq; uVar35 = uVar35 + 1) {
        uVar36 = (ulong)((uVar35 & 3) << 5);
        pBVar33 = *(BYTE **)((long)&sequences[0].litLength + uVar36);
        sVar31 = *(size_t *)((long)&sequences[0].matchLength + uVar36);
        pBVar20 = pBVar33 + sVar31;
        if ((long)pBVar20 <= (long)pBVar33) goto LAB_0014ab34;
        uVar26 = *(ulong *)((long)&sequences[0].offset + uVar36);
        pBVar22 = *(BYTE **)((long)&sequences[0].match + uVar36);
        pBVar29 = litPtr + (long)pBVar33;
        if ((pBVar25 < pBVar29) || (pBVar34 = local_1f8 + (long)pBVar20, local_f8 < pBVar34)) {
          sequence_01.matchLength = sVar31;
          sequence_01.litLength = (size_t)pBVar33;
          sequence_01.offset = uVar26;
          sequence_01.match = pBVar22;
          litPtr_1 = pBVar33;
          sStack_d0 = sVar31;
          uStack_c8 = uVar26;
          pBStack_c0 = pBVar22;
          pBVar20 = (BYTE *)ZSTD_execSequenceEnd
                                      (local_1f8,pBVar37,sequence_01,&litPtr,pBVar25,pBVar11,
                                       local_e0,pBVar12);
        }
        else {
          pBVar22 = local_1f8 + (long)pBVar33;
          if (local_f8 < pBVar22) goto LAB_0014ab53;
          uVar13 = *(undefined8 *)(litPtr + 8);
          *(undefined8 *)local_1f8 = *(undefined8 *)litPtr;
          *(undefined8 *)(local_1f8 + 8) = uVar13;
          if ((BYTE *)0x10 < pBVar33) {
            lVar17 = (long)(local_1f8 + 0x10) - (long)(litPtr + 0x10);
            if (lVar17 < 8) {
              if (-0x10 < lVar17) goto LAB_0014abcf;
            }
            else if (0xffffffffffffffe0 < lVar17 - 0x10U) goto LAB_0014abee;
            uVar13 = *(undefined8 *)(litPtr + 0x18);
            *(undefined8 *)(local_1f8 + 0x10) = *(undefined8 *)(litPtr + 0x10);
            *(undefined8 *)(local_1f8 + 0x18) = uVar13;
            if (0x10 < (long)(pBVar33 + -0x10)) {
              lVar17 = 0;
              do {
                uVar13 = *(undefined8 *)(litPtr + lVar17 + 0x20 + 8);
                pBVar33 = local_1f8 + lVar17 + 0x20;
                *(undefined8 *)pBVar33 = *(undefined8 *)(litPtr + lVar17 + 0x20);
                *(undefined8 *)(pBVar33 + 8) = uVar13;
                uVar13 = *(undefined8 *)(litPtr + lVar17 + 0x30 + 8);
                *(undefined8 *)(pBVar33 + 0x10) = *(undefined8 *)(litPtr + lVar17 + 0x30);
                *(undefined8 *)(pBVar33 + 0x18) = uVar13;
                lVar17 = lVar17 + 0x20;
              } while (pBVar33 + 0x20 < pBVar22);
            }
          }
          pBVar33 = pBVar22 + -uVar26;
          litPtr = pBVar29;
          if ((ulong)((long)pBVar22 - (long)pBVar11) < uVar26) {
            if ((ulong)((long)pBVar22 - (long)local_e0) < uVar26) {
              return 0xffffffffffffffec;
            }
            lVar17 = (long)(pBVar22 + -uVar26) - (long)pBVar11;
            pBVar33 = pBVar12 + lVar17;
            if (pBVar33 + sVar31 <= pBVar12) {
              memmove(pBVar22,pBVar33,sVar31);
              goto LAB_0014a847;
            }
            memmove(pBVar22,pBVar33,-lVar17);
            pBVar22 = pBVar22 + -lVar17;
            sVar31 = sVar31 + lVar17;
            pBVar33 = pBVar11;
          }
          if (pBVar34 < pBVar22) goto LAB_0014ab91;
          if (pBVar33 < pBVar11) goto LAB_0014ab72;
          if (sVar31 == 0) goto LAB_0014abb0;
          if (uVar26 < 0x10) {
            if (pBVar22 < pBVar33) goto LAB_0014ac6a;
            if (uVar26 < 8) {
              iVar24 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                ::dec64table + uVar26 * 4);
              *pBVar22 = *pBVar33;
              pBVar22[1] = pBVar33[1];
              pBVar22[2] = pBVar33[2];
              pBVar22[3] = pBVar33[3];
              pBVar29 = pBVar33 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                            ::dec32table + uVar26 * 4);
              pBVar33 = pBVar33 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar26 * 4) - (long)iVar24);
              *(undefined4 *)(pBVar22 + 4) = *(undefined4 *)pBVar29;
            }
            else {
              *(undefined8 *)pBVar22 = *(undefined8 *)pBVar33;
            }
            pBVar23 = pBVar33 + 8;
            pBVar29 = pBVar22 + 8;
            if ((long)pBVar29 - (long)pBVar23 < 8) goto LAB_0014ac4b;
            if (8 < sVar31) {
              if (pBVar34 <= pBVar29) goto LAB_0014ac89;
              if ((ulong)((long)pBVar29 - (long)pBVar23) < 0x10) {
                do {
                  *(undefined8 *)pBVar29 = *(undefined8 *)pBVar23;
                  pBVar29 = pBVar29 + 8;
                  pBVar23 = pBVar23 + 8;
                } while (pBVar29 < pBVar22 + sVar31);
              }
              else {
                uVar13 = *(undefined8 *)(pBVar33 + 0x10);
                *(undefined8 *)pBVar29 = *(undefined8 *)pBVar23;
                *(undefined8 *)(pBVar22 + 0x10) = uVar13;
                if (0x18 < (long)sVar31) {
                  lVar17 = 0;
                  do {
                    uVar13 = *(undefined8 *)(pBVar33 + lVar17 + 0x18 + 8);
                    pBVar29 = pBVar22 + lVar17 + 0x18;
                    *(undefined8 *)pBVar29 = *(undefined8 *)(pBVar33 + lVar17 + 0x18);
                    *(undefined8 *)(pBVar29 + 8) = uVar13;
                    uVar13 = *(undefined8 *)(pBVar33 + lVar17 + 0x28 + 8);
                    *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)(pBVar33 + lVar17 + 0x28);
                    *(undefined8 *)(pBVar29 + 0x18) = uVar13;
                    lVar17 = lVar17 + 0x20;
                  } while (pBVar29 + 0x20 < pBVar22 + sVar31);
                }
              }
            }
          }
          else {
            lVar17 = (long)pBVar22 - (long)pBVar33;
            if (lVar17 < 8) {
              if (-0x10 < lVar17) goto LAB_0014abcf;
            }
            else if (0xffffffffffffffe0 < lVar17 - 0x10U) goto LAB_0014abee;
            uVar13 = *(undefined8 *)(pBVar33 + 8);
            *(undefined8 *)pBVar22 = *(undefined8 *)pBVar33;
            *(undefined8 *)(pBVar22 + 8) = uVar13;
            if (0x10 < (long)sVar31) {
              lVar17 = 0x10;
              do {
                uVar13 = *(undefined8 *)(pBVar33 + lVar17 + 8);
                pBVar29 = pBVar22 + lVar17;
                *(undefined8 *)pBVar29 = *(undefined8 *)(pBVar33 + lVar17);
                *(undefined8 *)(pBVar29 + 8) = uVar13;
                uVar13 = *(undefined8 *)(pBVar33 + lVar17 + 0x10 + 8);
                *(undefined8 *)(pBVar29 + 0x10) = *(undefined8 *)(pBVar33 + lVar17 + 0x10);
                *(undefined8 *)(pBVar29 + 0x18) = uVar13;
                lVar17 = lVar17 + 0x20;
              } while (pBVar29 + 0x20 < pBVar22 + sVar31);
            }
          }
        }
LAB_0014a847:
        if ((BYTE *)0xffffffffffffff88 < pBVar20) {
          return (size_t)pBVar20;
        }
        local_1f8 = local_1f8 + (long)pBVar20;
      }
      for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
        (dctx->entropy).rep[lVar17] = (U32)local_128[lVar17];
      }
    }
    sVar31 = (long)pBVar25 - (long)litPtr;
    if ((ulong)((long)pBVar37 - (long)local_1f8) < sVar31) {
      return 0xffffffffffffffba;
    }
    memcpy(local_1f8,litPtr,sVar31);
    return (size_t)(local_1f8 + (sVar31 - (long)dst));
  }
LAB_001497e1:
  if (dctx->bmi2 != 0) {
    sVar15 = ZSTD_decompressSequences_bmi2
                       (dctx,dst,dstCapacity,srcBuffer,sVar16,nbSeq,in_stack_fffffffffffffdc8);
    return sVar15;
  }
  pBVar37 = (BYTE *)(dstCapacity + (long)dst);
  litPtr_1 = dctx->litPtr;
  pBVar25 = litPtr_1 + dctx->litSize;
  local_1d0 = (BYTE *)dst;
  if (nbSeq != 0) {
    pBVar11 = (BYTE *)dctx->prefixStart;
    local_f8 = (BYTE *)dctx->virtualStart;
    pBVar12 = (BYTE *)dctx->dictEnd;
    dctx->fseEntropy = 1;
    for (lVar17 = -6; lVar17 != 0; lVar17 = lVar17 + 2) {
      *(ulong *)((long)local_110 + lVar17 * 4) =
           (ulong)*(uint *)((long)dctx->workspace + lVar17 * 2);
    }
    sVar15 = BIT_initDStream(&local_180,srcBuffer,sVar16);
    if (0xffffffffffffff88 < sVar15) {
      return 0xffffffffffffffec;
    }
    ZSTD_initFseState(&local_158,&local_180,dctx->LLTptr);
    ZSTD_initFseState(&local_148,&local_180,dctx->OFTptr);
    ZSTD_initFseState(&local_138,&local_180,dctx->MLTptr);
    uVar36 = 0;
    iVar24 = nbSeq;
    do {
      uVar6 = local_158.table[local_158.state].nextState;
      bVar21 = local_158.table[local_158.state].nbAdditionalBits;
      bVar1 = local_158.table[local_158.state].nbBits;
      uVar26 = (ulong)local_158.table[local_158.state].baseValue;
      uVar7 = local_138.table[local_138.state].nextState;
      bVar2 = local_138.table[local_138.state].nbAdditionalBits;
      bVar3 = local_138.table[local_138.state].nbBits;
      uVar28 = (ulong)local_138.table[local_138.state].baseValue;
      uVar8 = local_148.table[local_148.state].nextState;
      bVar4 = local_148.table[local_148.state].nbAdditionalBits;
      bVar5 = local_148.table[local_148.state].nbBits;
      uVar35 = local_148.table[local_148.state].baseValue;
      _nbBits = uVar36;
      if (bVar4 < 2) {
        if (bVar4 == 0) {
          if (uVar26 == 0) {
            uVar36 = local_128[0];
            local_128[0] = local_128[1];
            local_128[1] = uVar36;
          }
        }
        else {
          sVar15 = BIT_readBitsFast(&local_180,1);
          lVar17 = sVar15 + (uVar35 + (uVar26 == 0));
          if (lVar17 == 3) {
            uVar36 = (local_128[0] - 1) + (ulong)(local_128[0] == 1);
LAB_0014a58e:
            local_128[2] = local_128[1];
          }
          else {
            uVar36 = local_128[lVar17] + (ulong)(local_128[lVar17] == 0);
            if (lVar17 != 1) goto LAB_0014a58e;
          }
          local_128[1] = local_128[0];
          local_128[0] = uVar36;
        }
      }
      else {
        if (0x1f < bVar4) {
LAB_0014ab15:
          __assert_fail("ofBits <= MaxOff",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x6407,
                        "seq_t ZSTD_decodeSequence(seqState_t *, const ZSTD_longOffset_e, const ZSTD_prefetch_e)"
                       );
        }
        sVar15 = BIT_readBitsFast(&local_180,(uint)bVar4);
        local_128[2] = local_128[1];
        local_128[1] = local_128[0];
        local_128[0] = sVar15 + uVar35;
      }
      uVar36 = local_128[0];
      if (bVar2 != 0) {
        sVar15 = BIT_readBitsFast(&local_180,(uint)bVar2);
        uVar28 = uVar28 + sVar15;
      }
      if (0x1e < (byte)(bVar2 + bVar21 + bVar4)) {
        BIT_reloadDStream(&local_180);
      }
      if (bVar21 != 0) {
        sVar15 = BIT_readBitsFast(&local_180,(uint)bVar21);
        uVar26 = uVar26 + sVar15;
      }
      local_158.state = BIT_readBits(&local_180,(uint)bVar1);
      local_158.state = local_158.state + uVar6;
      local_138.state = BIT_readBits(&local_180,(uint)bVar3);
      local_138.state = local_138.state + uVar7;
      local_148.state = BIT_readBits(&local_180,(uint)bVar5);
      local_148.state = local_148.state + uVar8;
      uVar32 = uVar28 + uVar26;
      if ((long)uVar32 <= (long)uVar26) {
LAB_0014ab34:
        __assert_fail("oLitEnd < oMatchEnd",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                      ,0x6386,
                      "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                     );
      }
      pBVar20 = litPtr_1 + uVar26;
      if ((pBVar25 < pBVar20) || (pBVar33 = local_1d0 + uVar32, pBVar37 + -0x20 < pBVar33)) {
        sequence_00.matchLength = uVar28;
        sequence_00.litLength = uVar26;
        sequence_00.offset = uVar36;
        sequence_00.match = sequences[0].match;
        sequences[0].litLength = uVar26;
        sequences[0].matchLength = uVar28;
        sequences[0].offset = uVar36;
        uVar26 = ZSTD_execSequenceEnd
                           (local_1d0,pBVar37,sequence_00,&litPtr_1,pBVar25,pBVar11,local_f8,pBVar12
                           );
      }
      else {
        pBVar29 = local_1d0 + uVar26;
        if (pBVar37 + -0x20 < pBVar29) {
LAB_0014ab53:
          __assert_fail("oLitEnd <= oend_w",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                        ,0x638c,
                        "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                       );
        }
        uVar13 = *(undefined8 *)(litPtr_1 + 8);
        *(undefined8 *)local_1d0 = *(undefined8 *)litPtr_1;
        *(undefined8 *)(local_1d0 + 8) = uVar13;
        if (0x10 < uVar26) {
          lVar17 = (long)(local_1d0 + 0x10) - (long)(litPtr_1 + 0x10);
          if (lVar17 < 8) {
            if (-0x10 < lVar17) {
LAB_0014abcf:
              __assert_fail("diff >= 8 || (ovtype == ZSTD_no_overlap && diff <= -WILDCOPY_VECLEN)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x1268,
                            "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                           );
            }
          }
          else if (0xffffffffffffffe0 < lVar17 - 0x10U) {
LAB_0014abee:
            __assert_fail("diff >= WILDCOPY_VECLEN || diff <= -WILDCOPY_VECLEN",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x1270,
                          "void ZSTD_wildcopy(void *, const void *, ptrdiff_t, const ZSTD_overlap_e)"
                         );
          }
          uVar13 = *(undefined8 *)(litPtr_1 + 0x18);
          *(undefined8 *)(local_1d0 + 0x10) = *(undefined8 *)(litPtr_1 + 0x10);
          *(undefined8 *)(local_1d0 + 0x18) = uVar13;
          if (0x10 < (long)(uVar26 - 0x10)) {
            lVar17 = 0;
            do {
              uVar13 = *(undefined8 *)(litPtr_1 + lVar17 + 0x20 + 8);
              pBVar22 = local_1d0 + lVar17 + 0x20;
              *(undefined8 *)pBVar22 = *(undefined8 *)(litPtr_1 + lVar17 + 0x20);
              *(undefined8 *)(pBVar22 + 8) = uVar13;
              uVar13 = *(undefined8 *)(litPtr_1 + lVar17 + 0x30 + 8);
              *(undefined8 *)(pBVar22 + 0x10) = *(undefined8 *)(litPtr_1 + lVar17 + 0x30);
              *(undefined8 *)(pBVar22 + 0x18) = uVar13;
              lVar17 = lVar17 + 0x20;
            } while (pBVar22 + 0x20 < pBVar29);
          }
        }
        pBVar22 = pBVar29 + -uVar36;
        litPtr_1 = pBVar20;
        if ((ulong)((long)pBVar29 - (long)pBVar11) < uVar36) {
          uVar26 = 0xffffffffffffffec;
          if (uVar36 <= (ulong)((long)pBVar29 - (long)local_f8)) {
            lVar17 = (long)(pBVar29 + -uVar36) - (long)pBVar11;
            pBVar20 = pBVar12 + lVar17;
            if (pBVar12 < pBVar20 + uVar28) {
              memmove(pBVar29,pBVar20,-lVar17);
              pBVar29 = pBVar29 + -lVar17;
              uVar28 = uVar28 + lVar17;
              pBVar22 = pBVar11;
              goto LAB_0014a293;
            }
            memmove(pBVar29,pBVar20,uVar28);
            uVar26 = uVar32;
          }
        }
        else {
LAB_0014a293:
          if (pBVar33 < pBVar29) {
LAB_0014ab91:
            __assert_fail("op <= oMatchEnd",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63ac,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (pBVar22 < pBVar11) {
LAB_0014ab72:
            __assert_fail("match >= prefixStart",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63ae,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (uVar28 == 0) {
LAB_0014abb0:
            __assert_fail("sequence.matchLength >= 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                          ,0x63af,
                          "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                         );
          }
          if (uVar36 < 0x10) {
            if (pBVar29 < pBVar22) {
LAB_0014ac6a:
              __assert_fail("*ip <= *op",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x6301,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            if (uVar36 < 8) {
              iVar10 = *(int *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                ::dec64table + uVar36 * 4);
              *pBVar29 = *pBVar22;
              pBVar29[1] = pBVar22[1];
              pBVar29[2] = pBVar22[2];
              pBVar29[3] = pBVar22[3];
              pBVar20 = pBVar22 + *(uint *)(ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                            ::dec32table + uVar36 * 4);
              pBVar22 = pBVar22 + ((ulong)*(uint *)(
                                                  ZSTD_overlapCopy8(unsigned_char**,unsigned_char_const**,unsigned_long)
                                                  ::dec32table + uVar36 * 4) - (long)iVar10);
              *(undefined4 *)(pBVar29 + 4) = *(undefined4 *)pBVar20;
            }
            else {
              *(undefined8 *)pBVar29 = *(undefined8 *)pBVar22;
            }
            pBVar20 = pBVar22 + 8;
            pBVar34 = pBVar29 + 8;
            if ((long)pBVar34 - (long)pBVar20 < 8) {
LAB_0014ac4b:
              __assert_fail("*op - *ip >= 8",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                            ,0x6313,"void ZSTD_overlapCopy8(BYTE **, const BYTE **, size_t)");
            }
            uVar26 = uVar32;
            if (8 < uVar28) {
              if (pBVar33 <= pBVar34) {
LAB_0014ac89:
                __assert_fail("op < oMatchEnd",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                              ,0x63c3,
                              "size_t ZSTD_execSequence(BYTE *, BYTE *const, seq_t, const BYTE **, const BYTE *const, const BYTE *const, const BYTE *const, const BYTE *const)"
                             );
              }
              if ((ulong)((long)pBVar34 - (long)pBVar20) < 0x10) {
                do {
                  *(undefined8 *)pBVar34 = *(undefined8 *)pBVar20;
                  pBVar34 = pBVar34 + 8;
                  pBVar20 = pBVar20 + 8;
                } while (pBVar34 < pBVar29 + uVar28);
              }
              else {
                uVar13 = *(undefined8 *)(pBVar22 + 0x10);
                *(undefined8 *)pBVar34 = *(undefined8 *)pBVar20;
                *(undefined8 *)(pBVar29 + 0x10) = uVar13;
                if (0x18 < (long)uVar28) {
                  lVar17 = 0;
                  do {
                    uVar13 = *(undefined8 *)(pBVar22 + lVar17 + 0x18 + 8);
                    pBVar20 = pBVar29 + lVar17 + 0x18;
                    *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar22 + lVar17 + 0x18);
                    *(undefined8 *)(pBVar20 + 8) = uVar13;
                    uVar13 = *(undefined8 *)(pBVar22 + lVar17 + 0x28 + 8);
                    *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar22 + lVar17 + 0x28);
                    *(undefined8 *)(pBVar20 + 0x18) = uVar13;
                    lVar17 = lVar17 + 0x20;
                  } while (pBVar20 + 0x20 < pBVar29 + uVar28);
                }
              }
            }
          }
          else {
            lVar17 = (long)pBVar29 - (long)pBVar22;
            if (lVar17 < 8) {
              if (-0x10 < lVar17) goto LAB_0014abcf;
            }
            else if (0xffffffffffffffe0 < lVar17 - 0x10U) goto LAB_0014abee;
            uVar13 = *(undefined8 *)(pBVar22 + 8);
            *(undefined8 *)pBVar29 = *(undefined8 *)pBVar22;
            *(undefined8 *)(pBVar29 + 8) = uVar13;
            uVar26 = uVar32;
            if (0x10 < (long)uVar28) {
              lVar17 = 0x10;
              do {
                uVar13 = *(undefined8 *)(pBVar22 + lVar17 + 8);
                pBVar20 = pBVar29 + lVar17;
                *(undefined8 *)pBVar20 = *(undefined8 *)(pBVar22 + lVar17);
                *(undefined8 *)(pBVar20 + 8) = uVar13;
                uVar13 = *(undefined8 *)(pBVar22 + lVar17 + 0x10 + 8);
                *(undefined8 *)(pBVar20 + 0x10) = *(undefined8 *)(pBVar22 + lVar17 + 0x10);
                *(undefined8 *)(pBVar20 + 0x18) = uVar13;
                lVar17 = lVar17 + 0x20;
              } while (pBVar20 + 0x20 < pBVar29 + uVar28);
            }
          }
        }
      }
      BIT_reloadDStream(&local_180);
      uVar36 = _nbBits;
      if (0xffffffffffffff88 < uVar26) {
        uVar36 = uVar26;
        uVar26 = 0;
      }
      local_1d0 = local_1d0 + uVar26;
      iVar24 = iVar24 + -1;
    } while (iVar24 != 0);
    if (0xffffffffffffff88 < uVar36) {
      return uVar36;
    }
    BVar14 = BIT_reloadDStream(&local_180);
    if (BVar14 < BIT_DStream_completed) {
      return 0xffffffffffffffec;
    }
    for (lVar17 = 0; lVar17 != 3; lVar17 = lVar17 + 1) {
      (dctx->entropy).rep[lVar17] = (U32)local_128[lVar17];
    }
  }
  uVar36 = (long)pBVar25 - (long)litPtr_1;
  if ((ulong)((long)pBVar37 - (long)local_1d0) < uVar36) {
    return 0xffffffffffffffba;
  }
  memcpy(local_1d0,litPtr_1,uVar36);
  return (size_t)(local_1d0 + (uVar36 - (long)dst));
}

Assistant:

size_t
ZSTD_decompressBlock_internal(ZSTD_DCtx* dctx,
                              void* dst, size_t dstCapacity,
                        const void* src, size_t srcSize, const int frame)
{   /* blockType == blockCompressed */
    const BYTE* ip = (const BYTE*)src;
    /* isLongOffset must be true if there are long offsets.
     * Offsets are long if they are larger than 2^STREAM_ACCUMULATOR_MIN.
     * We don't expect that to be the case in 64-bit mode.
     * In block mode, window size is not known, so we have to be conservative.
     * (note: but it could be evaluated from current-lowLimit)
     */
    ZSTD_longOffset_e const isLongOffset = (ZSTD_longOffset_e)(MEM_32bits() && (!frame || (dctx->fParams.windowSize > (1ULL << STREAM_ACCUMULATOR_MIN))));
    DEBUGLOG(5, "ZSTD_decompressBlock_internal (size : %u)", (U32)srcSize);

    RETURN_ERROR_IF(srcSize >= ZSTD_BLOCKSIZE_MAX, srcSize_wrong);

    /* Decode literals section */
    {   size_t const litCSize = ZSTD_decodeLiteralsBlock(dctx, src, srcSize);
        DEBUGLOG(5, "ZSTD_decodeLiteralsBlock : %u", (U32)litCSize);
        if (ZSTD_isError(litCSize)) return litCSize;
        ip += litCSize;
        srcSize -= litCSize;
    }

    /* Build Decoding Tables */
    {
        /* These macros control at build-time which decompressor implementation
         * we use. If neither is defined, we do some inspection and dispatch at
         * runtime.
         */
#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        int usePrefetchDecoder = dctx->ddictIsCold;
#endif
        int nbSeq;
        size_t const seqHSize = ZSTD_decodeSeqHeaders(dctx, &nbSeq, ip, srcSize);
        if (ZSTD_isError(seqHSize)) return seqHSize;
        ip += seqHSize;
        srcSize -= seqHSize;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if ( !usePrefetchDecoder
          && (!frame || (dctx->fParams.windowSize > (1<<24)))
          && (nbSeq>ADVANCED_SEQS) ) {  /* could probably use a larger nbSeq limit */
            U32 const shareLongOffsets = ZSTD_getLongOffsetsShare(dctx->OFTptr);
            U32 const minShare = MEM_64bits() ? 7 : 20; /* heuristic values, correspond to 2.73% and 7.81% */
            usePrefetchDecoder = (shareLongOffsets >= minShare);
        }
#endif

        dctx->ddictIsCold = 0;

#if !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT) && \
    !defined(ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG)
        if (usePrefetchDecoder)
#endif
#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_SHORT
            return ZSTD_decompressSequencesLong(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif

#ifndef ZSTD_FORCE_DECOMPRESS_SEQUENCES_LONG
        /* else */
        return ZSTD_decompressSequences(dctx, dst, dstCapacity, ip, srcSize, nbSeq, isLongOffset);
#endif
    }
}